

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlParserErrors
xmlFindExtraHandler(char *norig,char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,
                   void *implCtxt,xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandlerPtr pxVar1;
  int iVar2;
  int ret;
  xmlCharEncodingHandler *h;
  int i;
  xmlCharEncodingHandler **out_local;
  void *implCtxt_local;
  xmlCharEncConvImpl impl_local;
  xmlCharEncFlags flags_local;
  char *name_local;
  char *norig_local;
  
  if (impl == (xmlCharEncConvImpl)0x0) {
    if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
      for (h._4_4_ = 0; h._4_4_ < nbCharEncodingHandler; h._4_4_ = h._4_4_ + 1) {
        pxVar1 = globalHandlers[h._4_4_];
        iVar2 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)pxVar1->name);
        if (((iVar2 == 0) &&
            (((flags & XML_ENC_INPUT) == 0 || ((pxVar1->input).func != (xmlCharEncConvFunc)0x0))))
           && (((flags & XML_ENC_OUTPUT) == 0 || ((pxVar1->output).func != (xmlCharEncConvFunc)0x0))
              )) {
          *out = pxVar1;
          return XML_ERR_OK;
        }
      }
    }
    norig_local._4_4_ = xmlCharEncIconv(name,flags,out);
    if (norig_local._4_4_ == XML_ERR_OK) {
      norig_local._4_4_ = XML_ERR_OK;
    }
    else if (norig_local._4_4_ == XML_ERR_UNSUPPORTED_ENCODING) {
      norig_local._4_4_ = XML_ERR_UNSUPPORTED_ENCODING;
    }
  }
  else {
    norig_local._4_4_ = (*impl)(implCtxt,norig,flags,out);
  }
  return norig_local._4_4_;
}

Assistant:

static xmlParserErrors
xmlFindExtraHandler(const char *norig, const char *name, xmlCharEncFlags flags,
                    xmlCharEncConvImpl impl, void *implCtxt,
                    xmlCharEncodingHandler **out) {
    /*
     * Try custom implementation before deprecated global handlers.
     *
     * Note that we pass the original name without deprecated
     * alias resolution.
     */
    if (impl != NULL)
        return(impl(implCtxt, norig, flags, out));

    /*
     * Deprecated
     */
    if (globalHandlers != NULL) {
        int i;

        for (i = 0; i < nbCharEncodingHandler; i++) {
            xmlCharEncodingHandler *h = globalHandlers[i];

            if (!xmlStrcasecmp((const xmlChar *) name,
                               (const xmlChar *) h->name)) {
                if ((((flags & XML_ENC_INPUT) == 0) || (h->input.func)) &&
                    (((flags & XML_ENC_OUTPUT) == 0) || (h->output.func))) {
                    *out = h;
                    return(XML_ERR_OK);
                }
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    {
        int ret = xmlCharEncIconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICONV_ENABLED */

#ifdef LIBXML_ICU_ENABLED
    {
        int ret = xmlCharEncUconv(name, flags, out);

        if (ret == XML_ERR_OK)
            return(XML_ERR_OK);
        if (ret != XML_ERR_UNSUPPORTED_ENCODING)
            return(ret);
    }
#endif /* LIBXML_ICU_ENABLED */

    return(XML_ERR_UNSUPPORTED_ENCODING);
}